

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O1

int Fl_Text_Editor::kf_shift_move(int c,Fl_Text_Editor *e)

{
  EVP_PKEY_CTX *dst;
  size_t sVar1;
  
  kf_move(c,e);
  fl_text_drag_me((e->super_Fl_Text_Display).mCursorPos,&e->super_Fl_Text_Display);
  dst = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text((e->super_Fl_Text_Display).mBuffer);
  if (dst != (EVP_PKEY_CTX *)0x0) {
    sVar1 = strlen((char *)dst);
    Fl::copy(dst,(EVP_PKEY_CTX *)(sVar1 & 0xffffffff));
    free(dst);
  }
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_shift_move(int c, Fl_Text_Editor* e) {
  kf_move(c, e);
  fl_text_drag_me(e->insert_position(), e);
  char *copy = e->buffer()->selection_text();
  if (copy) {
    Fl::copy(copy, (int) strlen(copy), 0);
    free(copy);
    }
  return 1;
}